

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color,opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *pOVar1;
  OPJ_BYTE *pOVar2;
  OPJ_UINT32 *pOVar3;
  opj_jp2_cmap_comp_t *poVar4;
  opj_image_comp_t *ptr;
  OPJ_INT32 *pOVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  opj_image_comp_t *ptr_00;
  OPJ_INT32 *pOVar11;
  int local_7c;
  OPJ_INT32 top_k;
  OPJ_INT32 k;
  OPJ_UINT16 pcol;
  OPJ_UINT16 cmp;
  OPJ_UINT16 nr_channels;
  OPJ_UINT16 i;
  OPJ_UINT32 max;
  OPJ_UINT32 j;
  OPJ_INT32 *dst;
  OPJ_INT32 *src;
  opj_jp2_cmap_comp_t *cmap;
  OPJ_UINT32 *entries;
  OPJ_BYTE *channel_sign;
  OPJ_BYTE *channel_size;
  opj_image_comp_t *new_comps;
  opj_image_comp_t *old_comps;
  opj_event_mgr_t *p_manager_local;
  opj_jp2_color_t *color_local;
  opj_image_t *image_local;
  
  pOVar1 = color->jp2_pclr->channel_size;
  pOVar2 = color->jp2_pclr->channel_sign;
  pOVar3 = color->jp2_pclr->entries;
  poVar4 = color->jp2_pclr->cmap;
  uVar6 = (ushort)color->jp2_pclr->nr_channels;
  for (k._2_2_ = 0; k._2_2_ < uVar6; k._2_2_ = k._2_2_ + 1) {
    if (image->comps[poVar4[k._2_2_].cmp].data == (OPJ_INT32 *)0x0) {
      opj_event_msg(p_manager,1,"image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n",
                    (ulong)k._2_2_);
      return 0;
    }
  }
  ptr = image->comps;
  ptr_00 = (opj_image_comp_t *)opj_malloc((ulong)uVar6 << 6);
  if (ptr_00 == (opj_image_comp_t *)0x0) {
    opj_event_msg(p_manager,1,"Memory allocation failure in opj_jp2_apply_pclr().\n");
    image_local._4_4_ = 0;
  }
  else {
    for (k._2_2_ = 0; k._2_2_ < uVar6; k._2_2_ = k._2_2_ + 1) {
      uVar7 = (ushort)poVar4[k._2_2_].pcol;
      uVar8 = poVar4[k._2_2_].cmp;
      if (poVar4[k._2_2_].mtyp == '\0') {
        if (uVar7 != 0) {
          __assert_fail("pcol == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x431,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        memcpy(ptr_00 + k._2_2_,ptr + uVar8,0x40);
      }
      else {
        if (k._2_2_ != uVar7) {
          __assert_fail("i == pcol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x434,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        memcpy(ptr_00 + uVar7,ptr + uVar8,0x40);
      }
      pOVar11 = (OPJ_INT32 *)opj_image_data_alloc((ulong)ptr[uVar8].w * 4 * (ulong)ptr[uVar8].h);
      ptr_00[k._2_2_].data = pOVar11;
      if (ptr_00[k._2_2_].data == (OPJ_INT32 *)0x0) {
        while (k._2_2_ != 0) {
          k._2_2_ = k._2_2_ - 1;
          opj_image_data_free(ptr_00[k._2_2_].data);
        }
        opj_free(ptr_00);
        opj_event_msg(p_manager,1,"Memory allocation failure in opj_jp2_apply_pclr().\n");
        return 0;
      }
      ptr_00[k._2_2_].prec = (uint)pOVar1[k._2_2_];
      ptr_00[k._2_2_].sgnd = (uint)pOVar2[k._2_2_];
    }
    iVar9 = color->jp2_pclr->nr_entries - 1;
    for (k._2_2_ = 0; k._2_2_ < uVar6; k._2_2_ = k._2_2_ + 1) {
      uVar8 = (ushort)poVar4[k._2_2_].pcol;
      pOVar11 = ptr[poVar4[k._2_2_].cmp].data;
      if (pOVar11 == (OPJ_INT32 *)0x0) {
        __assert_fail("src",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                      ,0x450,
                      "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                     );
      }
      uVar10 = ptr_00[uVar8].w * ptr_00[uVar8].h;
      if (poVar4[k._2_2_].mtyp == '\0') {
        pOVar5 = ptr_00[k._2_2_].data;
        if (pOVar5 == (OPJ_INT32 *)0x0) {
          __assert_fail("dst",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x456,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        for (_nr_channels = 0; _nr_channels < uVar10; _nr_channels = _nr_channels + 1) {
          pOVar5[_nr_channels] = pOVar11[_nr_channels];
        }
      }
      else {
        if (k._2_2_ != uVar8) {
          __assert_fail("i == pcol",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x45b,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        pOVar5 = ptr_00[uVar8].data;
        if (pOVar5 == (OPJ_INT32 *)0x0) {
          __assert_fail("dst",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/jp2.c"
                        ,0x45d,
                        "OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *, opj_jp2_color_t *, opj_event_mgr_t *)"
                       );
        }
        for (_nr_channels = 0; _nr_channels < uVar10; _nr_channels = _nr_channels + 1) {
          local_7c = pOVar11[_nr_channels];
          if (local_7c < 0) {
            local_7c = 0;
          }
          else if (iVar9 < local_7c) {
            local_7c = iVar9;
          }
          pOVar5[_nr_channels] = pOVar3[(int)(local_7c * (uint)uVar6 + (uint)uVar8)];
        }
      }
    }
    uVar10 = image->numcomps;
    for (k._2_2_ = 0; k._2_2_ < uVar10; k._2_2_ = k._2_2_ + 1) {
      if (ptr[k._2_2_].data != (OPJ_INT32 *)0x0) {
        opj_image_data_free(ptr[k._2_2_].data);
      }
    }
    opj_free(ptr);
    image->comps = ptr_00;
    image->numcomps = (uint)uVar6;
    image_local._4_4_ = 1;
  }
  return image_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_jp2_apply_pclr(opj_image_t *image,
                                   opj_jp2_color_t *color,
                                   opj_event_mgr_t * p_manager)
{
    opj_image_comp_t *old_comps, *new_comps;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    opj_jp2_cmap_comp_t *cmap;
    OPJ_INT32 *src, *dst;
    OPJ_UINT32 j, max;
    OPJ_UINT16 i, nr_channels, cmp, pcol;
    OPJ_INT32 k, top_k;

    channel_size = color->jp2_pclr->channel_size;
    channel_sign = color->jp2_pclr->channel_sign;
    entries = color->jp2_pclr->entries;
    cmap = color->jp2_pclr->cmap;
    nr_channels = color->jp2_pclr->nr_channels;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        if (image->comps[cmp].data == NULL) {
            opj_event_msg(p_manager, EVT_ERROR,
                          "image->comps[%d].data == NULL in opj_jp2_apply_pclr().\n", i);
            return OPJ_FALSE;
        }
    }

    old_comps = image->comps;
    new_comps = (opj_image_comp_t*)
                opj_malloc(nr_channels * sizeof(opj_image_comp_t));
    if (!new_comps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Memory allocation failure in opj_jp2_apply_pclr().\n");
        return OPJ_FALSE;
    }
    for (i = 0; i < nr_channels; ++i) {
        pcol = cmap[i].pcol;
        cmp = cmap[i].cmp;

        /* Direct use */
        if (cmap[i].mtyp == 0) {
            assert(pcol == 0);
            new_comps[i] = old_comps[cmp];
        } else {
            assert(i == pcol);
            new_comps[pcol] = old_comps[cmp];
        }

        /* Palette mapping: */
        new_comps[i].data = (OPJ_INT32*)
                            opj_image_data_alloc(sizeof(OPJ_INT32) * old_comps[cmp].w * old_comps[cmp].h);
        if (!new_comps[i].data) {
            while (i > 0) {
                -- i;
                opj_image_data_free(new_comps[i].data);
            }
            opj_free(new_comps);
            opj_event_msg(p_manager, EVT_ERROR,
                          "Memory allocation failure in opj_jp2_apply_pclr().\n");
            return OPJ_FALSE;
        }
        new_comps[i].prec = channel_size[i];
        new_comps[i].sgnd = channel_sign[i];
    }

    top_k = color->jp2_pclr->nr_entries - 1;

    for (i = 0; i < nr_channels; ++i) {
        /* Palette mapping: */
        cmp = cmap[i].cmp;
        pcol = cmap[i].pcol;
        src = old_comps[cmp].data;
        assert(src); /* verified above */
        max = new_comps[pcol].w * new_comps[pcol].h;

        /* Direct use: */
        if (cmap[i].mtyp == 0) {
            dst = new_comps[i].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                dst[j] = src[j];
            }
        } else {
            assert(i == pcol);
            dst = new_comps[pcol].data;
            assert(dst);
            for (j = 0; j < max; ++j) {
                /* The index */
                if ((k = src[j]) < 0) {
                    k = 0;
                } else if (k > top_k) {
                    k = top_k;
                }

                /* The colour */
                dst[j] = (OPJ_INT32)entries[k * nr_channels + pcol];
            }
        }
    }

    max = image->numcomps;
    for (i = 0; i < max; ++i) {
        if (old_comps[i].data) {
            opj_image_data_free(old_comps[i].data);
        }
    }

    opj_free(old_comps);
    image->comps = new_comps;
    image->numcomps = nr_channels;

    return OPJ_TRUE;
}